

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O0

void __thiscall
re::fft::fft<float,_512L,_(re::fft::direction)0>::operator()
          (fft<float,_512L,_(re::fft::direction)0> *this,span<const_std::complex<float>,_512L> in,
          span<std::complex<float>,_512L> out)

{
  fft<float,_512L,_(re::fft::direction)0> *this_local;
  span<std::complex<float>,_512L> out_local;
  span<const_std::complex<float>,_512L> in_local;
  
  fft<float,512l,(re::fft::direction)0>::step_in<512l,512l>
            ((fft<float,512l,(re::fft::direction)0> *)this,in,out);
  return;
}

Assistant:

void
    operator()(
        gsl::span<std::complex<T> const, N> in,
        gsl::span<std::complex<T>, N> out
    ) const noexcept
    {
        step_in(in, out);
    }